

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O0

int output_instructions(Function *fn,InstructionList *list)

{
  undefined1 local_40 [8];
  PtrListIterator insniter__;
  Instruction *pIStack_20;
  int rc;
  Instruction *insn;
  InstructionList *list_local;
  Function *fn_local;
  
  insniter__._20_4_ = 0;
  raviX_ptrlist_forward_iterator((PtrListIterator *)local_40,(PtrList *)list);
  pIStack_20 = (Instruction *)raviX_ptrlist_iter_next((PtrListIterator *)local_40);
  while ((pIStack_20 != (Instruction *)0x0 &&
         (insniter__._20_4_ = output_instruction(fn,pIStack_20), insniter__._20_4_ == 0))) {
    pIStack_20 = (Instruction *)raviX_ptrlist_iter_next((PtrListIterator *)local_40);
  }
  return insniter__._20_4_;
}

Assistant:

static int output_instructions(Function *fn, InstructionList *list)
{
	Instruction *insn;
	int rc = 0;
	FOR_EACH_PTR(list, Instruction, insn)
	{
		rc = output_instruction(fn, insn);
		if (rc != 0)
			break;
	}
	END_FOR_EACH_PTR(insn)
	return rc;
}